

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void algorithm_suite::copy_sequence(void)

{
  initializer_list<double> __l;
  undefined8 local_c8;
  value_type local_c0;
  undefined4 local_b4;
  size_type local_b0 [2];
  basic_moment<double,_(trial::online::with)1> *local_a0;
  basic_moment<double,_(trial::online::with)1> *local_98;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  undefined1 local_80 [8];
  moment<double> filter;
  allocator<double> local_59;
  double local_58 [5];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<double,_std::allocator<double>_> input;
  
  local_58[2] = 3.0;
  local_58[3] = 4.0;
  local_58[0] = 1.0;
  local_58[1] = 2.0;
  local_58[4] = 5.0;
  local_30 = local_58;
  local_28 = 5;
  std::allocator<double>::allocator(&local_59);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_20,__l,&local_59);
  std::allocator<double>::~allocator(&local_59);
  trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_80);
  local_88._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_20);
  local_90._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)local_20);
  local_98 = (basic_moment<double,_(trial::online::with)1> *)
             trial::online::
             push_inserter<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>
                       ((basic_moment<double,_(trial::online::with)1> *)local_80);
  local_a0 = (basic_moment<double,_(trial::online::with)1> *)
             std::
             copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,trial::online::push_iterator<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>>
                       (local_88,local_90,
                        (push_iterator<trial::online::cumulative::basic_moment<double,_(trial::online::with)1>_>
                         )local_98);
  local_b0[0] = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::size
                          ((basic_moment<double,_(trial::online::with)1> *)local_80);
  local_b4 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2cc,"void algorithm_suite::copy_sequence()",local_b0,&local_b4);
  local_c0 = trial::online::cumulative::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_80);
  local_c8 = 0x4008000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2cd,"void algorithm_suite::copy_sequence()",&local_c0,&local_c8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_20);
  return;
}

Assistant:

void copy_sequence()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0, 5.0 };
    cumulative::moment<double> filter;
    std::copy(input.begin(), input.end(), push_inserter(filter));
    TRIAL_TEST_EQ(filter.size(), 5);
    TRIAL_TEST_EQ(filter.mean(), 3.0);
}